

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

void find_ac(void)

{
  int iVar1;
  int iVar2;
  
  iVar2 = (int)mons[u.umonnum].ac;
  if (uarm != (obj *)0x0) {
    iVar1 = arm_bonus(uarm,&youmonst);
    iVar2 = iVar2 - iVar1;
  }
  if (uarmc != (obj *)0x0) {
    iVar1 = arm_bonus(uarmc,&youmonst);
    iVar2 = iVar2 - iVar1;
  }
  if (uarmh != (obj *)0x0) {
    iVar1 = arm_bonus(uarmh,&youmonst);
    iVar2 = iVar2 - iVar1;
  }
  if (uarmf != (obj *)0x0) {
    iVar1 = arm_bonus(uarmf,&youmonst);
    iVar2 = iVar2 - iVar1;
  }
  if (uarms != (obj *)0x0) {
    iVar1 = arm_bonus(uarms,&youmonst);
    iVar2 = iVar2 - iVar1;
  }
  if (uarmg != (obj *)0x0) {
    iVar1 = arm_bonus(uarmg,&youmonst);
    iVar2 = iVar2 - iVar1;
  }
  if (uarmu != (obj *)0x0) {
    iVar1 = arm_bonus(uarmu,&youmonst);
    iVar2 = iVar2 - iVar1;
  }
  if ((uleft != (obj *)0x0) && (uleft->otyp == 0xa5)) {
    iVar2 = iVar2 - uleft->spe;
  }
  if ((uright != (obj *)0x0) && (uright->otyp == 0xa5)) {
    iVar2 = iVar2 - uright->spe;
  }
  iVar1 = 0;
  if ((u.uprops[0x16].intrinsic._3_1_ & 7) != 0) {
    iVar1 = u.ublessed;
  }
  iVar2 = iVar2 - ((uint)u.uspellprot + iVar1);
  iVar1 = -0x80;
  if (-0x80 < iVar2) {
    iVar1 = iVar2;
  }
  if (iVar1 != u.uac) {
    u.uac = (schar)iVar1;
    iflags.botl = '\x01';
  }
  return;
}

Assistant:

void find_ac(void)
{
	int uac = mons[u.umonnum].ac;

	if (uarm) uac -= arm_bonus(uarm, &youmonst);
	if (uarmc) uac -= arm_bonus(uarmc, &youmonst);
	if (uarmh) uac -= arm_bonus(uarmh, &youmonst);
	if (uarmf) uac -= arm_bonus(uarmf, &youmonst);
	if (uarms) uac -= arm_bonus(uarms, &youmonst);
	if (uarmg) uac -= arm_bonus(uarmg, &youmonst);
	if (uarmu) uac -= arm_bonus(uarmu, &youmonst);
	if (uleft && uleft->otyp == RIN_PROTECTION) uac -= uleft->spe;
	if (uright && uright->otyp == RIN_PROTECTION) uac -= uright->spe;
	if (HProtection & INTRINSIC) uac -= u.ublessed;
	uac -= u.uspellprot;
	if (uac < -128) uac = -128;	/* u.uac is an schar */
	if (uac != u.uac){
		u.uac = uac;
		iflags.botl = 1;
	}
}